

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setIntParam(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,IntParam param,int value,bool init)

{
  SPxLPRational *pSVar1;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  long lVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  TYPE ttype;
  SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x_00;
  ulong uVar8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar8 = (ulong)param;
  if (((int)CONCAT71(in_register_00000009,init) == 0) &&
     (this->_currentSettings->_intParamValues[uVar8] == value)) {
    return true;
  }
  if (value < *(int *)(&DAT_0054ee80 + uVar8 * 4)) {
    return false;
  }
  if (*(int *)(&DAT_0054eef0 + uVar8 * 4) < value) {
    return false;
  }
  switch(uVar8) {
  case 0:
    if ((value != 1) && (value != -1)) {
      return false;
    }
    uVar6 = (uint)(value == 1) * 2 - 1;
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])(this->_realLP,(ulong)uVar6);
    pSVar1 = this->_rationalLP;
    if (pSVar1 != (SPxLPRational *)0x0) {
      (*(pSVar1->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x45])(pSVar1,(ulong)uVar6);
    }
    _invalidateSolution(this);
    break;
  case 1:
    goto joined_r0x003a2ec7;
  case 2:
  case 5:
  case 6:
  case 7:
  case 0x15:
  case 0x1a:
    break;
  case 3:
    if (1 < (uint)value) {
      return false;
    }
    (this->_slufactor).uptype = value;
    break;
  case 4:
    if (value == 0) {
      (this->_solver).
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .maxUpdates = 200;
    }
    else {
      (this->_solver).
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .maxUpdates = value;
    }
    break;
  case 8:
    (this->_solver).displayFreq = value;
    break;
  case 9:
    switch(value) {
    case 0:
      (this->spxout).m_verbosity = ERROR;
      break;
    case 1:
      (this->spxout).m_verbosity = WARNING;
      break;
    case 2:
      (this->spxout).m_verbosity = DEBUG;
      break;
    case 3:
      (this->spxout).m_verbosity = INFO1;
      break;
    case 4:
      (this->spxout).m_verbosity = INFO2;
      break;
    case 5:
      (this->spxout).m_verbosity = INFO3;
    }
    break;
  case 10:
    this->_boostedSimplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    switch(value) {
    case 0:
      this->_simplifier =
           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      break;
    case 1:
    case 3:
      this->_simplifier =
           &(this->_simplifierMainSM).
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &(this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      (*(this->_simplifierMainSM).
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._vptr_SPxSimplifier[0x14])(&this->_simplifierMainSM,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      pSVar2 = this->_boostedSimplifier;
      if (pSVar2 != (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   &(this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        (*pSVar2->_vptr_SPxSimplifier[0x14])(pSVar2,&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
      break;
    case 2:
      this->_simplifier =
           &(this->_simplifierMainSM).
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    default:
      goto LAB_003a2ea0;
    }
    break;
  case 0xb:
    this->_boostedScaler =
         (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    switch(value) {
    case 0:
      this->_scaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      goto switchD_003a2ec2_caseD_2;
    case 1:
      lVar5 = 0x22b0;
      break;
    case 2:
      lVar5 = 0x22f0;
      break;
    case 3:
      lVar5 = 0x2330;
      break;
    case 4:
      lVar5 = 0x2478;
      break;
    case 5:
      lVar5 = 0x2708;
      break;
    case 6:
      lVar5 = 0x25c0;
      break;
    default:
      goto LAB_003a2ea0;
    }
    pSVar3 = (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((long)&this->_vptr_SoPlexBase + lVar5);
    this->_scaler = pSVar3;
    (**(code **)(*(long *)((long)&this->_vptr_SoPlexBase + lVar5) + 0x60))
              (pSVar3,&this->_tolerances);
    pSVar4 = this->_boostedScaler;
    if (pSVar4 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      (*pSVar4->_vptr_SPxScaler[0xc])(pSVar4,&this->_tolerances);
    }
    break;
  case 0xc:
    switch(value) {
    case 0:
      this->_starter =
           (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      pSVar7 = (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
      goto LAB_003a32dc;
    case 1:
      lVar5 = 0x27d0;
      break;
    case 2:
      lVar5 = 0x2878;
      break;
    case 3:
      lVar5 = 0x2940;
      break;
    default:
      goto LAB_003a2ea0;
    }
    pSVar7 = (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((long)&this->_vptr_SoPlexBase + lVar5);
    this->_starter = pSVar7;
    (**(code **)(*(long *)((long)&this->_vptr_SoPlexBase + lVar5) + 0x28))
              (pSVar7,&this->_tolerances);
    pSVar7 = this->_starter;
LAB_003a32dc:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setStarter(&this->_solver,pSVar7,false);
    break;
  case 0xd:
    switch(value) {
    case 0:
      x_00 = &(this->_pricerAuto).
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 1:
      x_00 = &(this->_pricerDantzig).
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 2:
      x_00 = &(this->_pricerParMult).
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 3:
      x_00 = &(this->_pricerDevex).
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 4:
      x_00 = &(this->_pricerQuickSteep).
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 5:
      x_00 = (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&this->_pricerSteep;
      break;
    default:
      goto LAB_003a2ea0;
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setPricer(&this->_solver,x_00,false);
    break;
  case 0xe:
    switch(value) {
    case 0:
      x = &(this->_ratiotesterTextbook).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 1:
      x = &(this->_ratiotesterHarris).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 2:
      x = &(this->_ratiotesterFast).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      break;
    case 3:
      x = (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&this->_ratiotesterBoundFlipping;
      break;
    default:
      goto LAB_003a2ea0;
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTester(&this->_solver,x,false);
    break;
  case 0xf:
    if (value == 2) {
      _ensureRationalLP(this);
      (*(this->_rationalLP->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x45])
                (this->_rationalLP,(ulong)((uint)(this->_realLP->thesense != MINIMIZE) * 2 - 1));
    }
    else if (value == 1) {
      if (this->_currentSettings->_intParamValues[0xf] == 0) {
        _syncLPRational(this,true);
      }
    }
    else {
      if (value != 0) {
        return false;
      }
      if (this->_rationalLP != (SPxLPRational *)0x0) {
        (**(this->_rationalLP->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           .
           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._vptr_ClassArray)();
        spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
                  (&this->_rationalLP);
      }
    }
    break;
  case 0x10:
    if (1 < (uint)value) {
      return false;
    }
    break;
  case 0x11:
  case 0x12:
  case 0x14:
joined_r0x003a2ec7:
    if (2 < (uint)value) {
LAB_003a2ea0:
      return false;
    }
    break;
  case 0x13:
    if (value == 2) {
      ttype = WALLCLOCK_TIME;
    }
    else if (value == 1) {
      ttype = USER_TIME;
    }
    else {
      if (value != 0) {
        return false;
      }
      ttype = OFF;
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTiming(&this->_solver,ttype);
    break;
  case 0x16:
    pSVar3 = this->_scaler;
    if (pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      (*pSVar3->_vptr_SPxScaler[0xb])(pSVar3,(ulong)(uint)value,"intparam");
    }
    break;
  case 0x17:
    if (value == 2) {
      (this->_solver).polishObj = POLISH_FRACTIONALITY;
    }
    else if (value == 1) {
      (this->_solver).polishObj = POLISH_INTEGRALITY;
    }
    else {
      if (value != 0) {
        return false;
      }
      (this->_solver).polishObj = POLISH_OFF;
    }
    break;
  case 0x18:
    (this->_solver).printBasisMetric = value;
    break;
  case 0x19:
    setTimings(this,value);
    break;
  case 0x1b:
    (this->_solver).storeBasisSimplexFreq = value;
    (this->_boostedSolver).storeBasisSimplexFreq = value;
    break;
  default:
    goto LAB_003a2ea0;
  }
switchD_003a2ec2_caseD_2:
  this->_currentSettings->_intParamValues[uVar8] = value;
  return true;
}

Assistant:

bool SoPlexBase<R>::setIntParam(const IntParam param, const int value, const bool init)
{
   assert(param >= 0);
   assert(param < INTPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == intParam(param))
      return true;

   // check for a valid parameter value wrt bounds
   if(value < _currentSettings->intParam.lower[param]
         || value > _currentSettings->intParam.upper[param])
      return false;

   switch(param)
   {
   // objective sense
   case SoPlexBase<R>::OBJSENSE:
      if(value != SoPlexBase<R>::OBJSENSE_MAXIMIZE && value != SoPlexBase<R>::OBJSENSE_MINIMIZE)
         return false;

      _realLP->changeSense(value == SoPlexBase<R>::OBJSENSE_MAXIMIZE ? SPxLPBase<R>::MAXIMIZE :
                           SPxLPBase<R>::MINIMIZE);

      if(_rationalLP != nullptr)
         _rationalLP->changeSense(value == SoPlexBase<R>::OBJSENSE_MAXIMIZE ? SPxLPRational::MAXIMIZE :
                                  SPxLPRational::MINIMIZE);

      _invalidateSolution();
      break;

   // type of computational form, i.e., column or row representation
   case SoPlexBase<R>::REPRESENTATION:
      if(value != SoPlexBase<R>::REPRESENTATION_COLUMN && value != SoPlexBase<R>::REPRESENTATION_ROW
            && value != SoPlexBase<R>::REPRESENTATION_AUTO)
         return false;

      break;

   // type of algorithm, i.e., primal or dual
   case SoPlexBase<R>::ALGORITHM:
      // decide upon entering/leaving at solve time depending on representation
      break;

   // type of LU update
   case SoPlexBase<R>::FACTOR_UPDATE_TYPE:
      if(value != SoPlexBase<R>::FACTOR_UPDATE_TYPE_ETA && value != SoPlexBase<R>::FACTOR_UPDATE_TYPE_FT)
         return false;

      _slufactor.setUtype(value == SoPlexBase<R>::FACTOR_UPDATE_TYPE_ETA ? SLUFactor<R>::ETA :
                          SLUFactor<R>::FOREST_TOMLIN);
      break;

   // maximum number of updates before fresh factorization
   case SoPlexBase<R>::FACTOR_UPDATE_MAX:
      if(value == 0)
         _solver.basis().setMaxUpdates(SOPLEX_REFACTOR_INTERVAL);
      else
         _solver.basis().setMaxUpdates(value);

      break;

   // iteration limit (-1 if unlimited)
   case SoPlexBase<R>::ITERLIMIT:
      break;

   // refinement limit (-1 if unlimited)
   case SoPlexBase<R>::REFLIMIT:
      break;

   // stalling refinement limit (-1 if unlimited)
   case SoPlexBase<R>::STALLREFLIMIT:
      break;

   // display frequency
   case SoPlexBase<R>::DISPLAYFREQ:
      _solver.setDisplayFreq(value);
      break;

   // verbosity level
   case SoPlexBase<R>::VERBOSITY:
      switch(value)
      {
      case 0:
         spxout.setVerbosity(SPxOut::ERROR);
         break;

      case 1:
         spxout.setVerbosity(SPxOut::WARNING);
         break;

      case 2:
         spxout.setVerbosity(SPxOut::DEBUG);
         break;

      case 3:
         spxout.setVerbosity(SPxOut::INFO1);
         break;

      case 4:
         spxout.setVerbosity(SPxOut::INFO2);
         break;

      case 5:
         spxout.setVerbosity(SPxOut::INFO3);
         break;
      }

      break;

   // type of simplifier
   case SoPlexBase<R>::SIMPLIFIER:
#ifndef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif

      switch(value)
      {
      case SIMPLIFIER_OFF:
         _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = nullptr;
#endif
         break;

      case SIMPLIFIER_INTERNAL:
      case SIMPLIFIER_AUTO:
         _simplifier = &_simplifierMainSM;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierMainSM;
         assert(_boostedSimplifier != nullptr);
#endif
         break;

      case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
         _simplifier = &_simplifierPaPILO;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierPaPILO;
         assert(_boostedSimplifier != nullptr);
#endif
         break;
#else
         _simplifier = &_simplifierMainSM;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierMainSM;
         assert(_boostedSimplifier != nullptr);
#endif
         return false;
#endif

      default:
         return false;
      }

      if(_simplifier != nullptr)
         _simplifier->setTolerances(this->_tolerances);

      if(_boostedSimplifier != nullptr)
         _boostedSimplifier->setTolerances(this->_tolerances);

      break;

   // type of scaler
   case SoPlexBase<R>::SCALER:
#ifndef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif

      switch(value)
      {
      case SCALER_OFF:
         _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = nullptr;
#endif
         break;

      case SCALER_UNIEQUI:
         _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerUniequi;
#endif
         break;

      case SCALER_BIEQUI:
         _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerBiequi;
#endif
         break;

      case SCALER_GEO1:
         _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeo1;
#endif
         break;

      case SCALER_GEO8:
         _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeo8;
#endif
         break;

      case SCALER_LEASTSQ:
         _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerLeastsq;
#endif
         break;

      case SCALER_GEOEQUI:
         _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeoequi;
#endif
         break;

      default:
         return false;
      }

      if(_scaler != nullptr)
         _scaler->setTolerances(this->_tolerances);

      if(_boostedScaler != nullptr)
         _boostedScaler->setTolerances(this->_tolerances);

      break;

   // type of starter used to create crash basis
   case SoPlexBase<R>::STARTER:
      switch(value)
      {
      case STARTER_OFF:
         _starter = nullptr;
         break;

      case STARTER_WEIGHT:
         _starter = &_starterWeight;
         break;

      case STARTER_SUM:
         _starter = &_starterSum;
         break;

      case STARTER_VECTOR:
         _starter = &_starterVector;
         break;

      default:
         return false;
      }

      if(_starter != nullptr)
         _starter->setTolerances(this->_tolerances);

      _solver.setStarter(_starter, false);
      break;

   // type of pricer
   case SoPlexBase<R>::PRICER:
      switch(value)
      {
      case PRICER_AUTO:
         _solver.setPricer(&_pricerAuto);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerAuto);
#endif
         break;

      case PRICER_DANTZIG:
         _solver.setPricer(&_pricerDantzig);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerDantzig);
#endif
         break;

      case PRICER_PARMULT:
         _solver.setPricer(&_pricerParMult);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerParMult);
#endif
         break;

      case PRICER_DEVEX:
         _solver.setPricer(&_pricerDevex);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerDevex);
#endif
         break;

      case PRICER_QUICKSTEEP:
         _solver.setPricer(&_pricerQuickSteep);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerQuickSteep);
#endif
         break;

      case PRICER_STEEP:
         _solver.setPricer(&_pricerSteep);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerSteep);
#endif
         break;

      default:
         return false;
      }

      break;

   // mode for synchronizing real and rational LP
   case SoPlexBase<R>::SYNCMODE:
      switch(value)
      {
      case SYNCMODE_ONLYREAL:
         if(_rationalLP != nullptr)
         {
            _rationalLP->~SPxLPRational();
            spx_free(_rationalLP);
         }

         break;

      case SYNCMODE_AUTO:
         if(intParam(param) == SYNCMODE_ONLYREAL)
            _syncLPRational();

         break;

      case SYNCMODE_MANUAL:
         _ensureRationalLP();
         assert(_realLP != nullptr);
         _rationalLP->changeSense(_realLP->spxSense() == SPxLPBase<R>::MINIMIZE ? SPxLPRational::MINIMIZE :
                                  SPxLPRational::MAXIMIZE);
         break;

      default:
         return false;
      }

      break;

   // mode for reading LP files; nothing to do but change the value if valid
   case SoPlexBase<R>::READMODE:
      switch(value)
      {
#ifndef SOPLEX_WITH_BOOST

      case READMODE_REAL:
         break;

      case READMODE_RATIONAL:
         SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
         return false;
#else

      case READMODE_REAL:
      case READMODE_RATIONAL:
         break;
#endif

      default:
         return false;
      }

      break;

   // mode for iterative refinement strategy; nothing to do but change the value if valid
   case SoPlexBase<R>::SOLVEMODE:
      switch(value)
      {
#ifndef SOPLEX_WITH_BOOST

      case SOLVEMODE_REAL:
      case SOLVEMODE_AUTO:
         break;

      case SOLVEMODE_RATIONAL:
         SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
         return false;
#else

      case SOLVEMODE_REAL:
      case SOLVEMODE_AUTO:
      case SOLVEMODE_RATIONAL:

         break;
#endif

      default:
         return false;
      }

      break;

   // mode for a posteriori feasibility checks; nothing to do but change the value if valid
   case SoPlexBase<R>::CHECKMODE:
      switch(value)
      {
      case CHECKMODE_REAL:
      case CHECKMODE_AUTO:
      case CHECKMODE_RATIONAL:
         break;

      default:
         return false;
      }

      break;

   // type of ratio test
   case SoPlexBase<R>::RATIOTESTER:
      switch(value)
      {
      case RATIOTESTER_TEXTBOOK:
         _solver.setTester(&_ratiotesterTextbook);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterTextbook);
#endif
         break;

      case RATIOTESTER_HARRIS:
         _solver.setTester(&_ratiotesterHarris);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterHarris);
#endif
         break;

      case RATIOTESTER_FAST:
         _solver.setTester(&_ratiotesterFast);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterFast);
#endif
         break;

      case RATIOTESTER_BOUNDFLIPPING:
         _solver.setTester(&_ratiotesterBoundFlipping);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterBoundFlipping);
#endif
         break;

      default:
         return false;
      }

      break;

   // type of timer
   case SoPlexBase<R>::TIMER:
      switch(value)
      {
      case TIMER_OFF:
         _solver.setTiming(Timer::OFF);
         break;

      case TIMER_CPU:
         _solver.setTiming(Timer::USER_TIME);
         break;

      case TIMER_WALLCLOCK:
         _solver.setTiming(Timer::WALLCLOCK_TIME);
         break;

      default:
         return false;
      }

      break;

   // mode of hyper pricing
   case SoPlexBase<R>::HYPER_PRICING:
      switch(value)
      {
      case HYPER_PRICING_OFF:
      case HYPER_PRICING_AUTO:
      case HYPER_PRICING_ON:
         break;

      default:
         return false;
      }

      break;

   // minimum number of stalling refinements since last pivot to trigger rational factorization
   case SoPlexBase<R>::RATFAC_MINSTALLS:
      break;

   // maximum number of conjugate gradient iterations in least square scaling
   case SoPlexBase<R>::LEASTSQ_MAXROUNDS:
      if(_scaler)
         _scaler->setIntParam(value);

      break;

   // mode of solution polishing
   case SoPlexBase<R>::SOLUTION_POLISHING:
      switch(value)
      {
      case POLISHING_OFF:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
         break;

      case POLISHING_INTEGRALITY:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_INTEGRALITY);
         break;

      case POLISHING_FRACTIONALITY:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_FRACTIONALITY);
         break;

      default:
         return false;
      }

      break;

   // printing of condition n
   case PRINTBASISMETRIC:
      _solver.setMetricInformation(value);
      break;

   case STATTIMER:
      setTimings((Timer::TYPE) value);
      break;

   // maximum number of digits for the multiprecision type
   case SoPlexBase<R>::MULTIPRECISION_LIMIT:
      break;

   case SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ:
      // attributes in solvers need to be updated
      _solver.setStoreBasisFreqForBoosting(value);
      _boostedSolver.setStoreBasisFreqForBoosting(value);
      break;

   default:
      return false;
   }

   _currentSettings->_intParamValues[param] = value;
   return true;
}